

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

Document * __thiscall svg::Document::operator<<(Document *this,Shape *shape)

{
  long *in_RSI;
  Document *in_RDI;
  string local_30 [48];
  
  (**(code **)(*in_RSI + 0x10))(local_30,in_RSI,&in_RDI->layout);
  std::__cxx11::string::operator+=((string *)&in_RDI->body_nodes_str,local_30);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

Document & operator<<(Shape const & shape)
        {
            body_nodes_str += shape.toString(layout);
            return *this;
        }